

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::DefineGroupNode::AnnotatePass2
          (DefineGroupNode *this,Compiler *compiler,CountDomain accumConsumes,
          bool accumPrevWillNotProgress,bool accumPrevWillNotRegress)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  (this->super_Node).prevConsumes = accumConsumes;
  *(uint *)&(this->super_Node).field_0xc =
       (int)CONCAT71(in_register_00000081,accumPrevWillNotRegress) << 7 |
       (int)CONCAT71(in_register_00000009,accumPrevWillNotProgress) << 6 |
       *(uint *)&(this->super_Node).field_0xc & 0xffffff3f;
  (*this->body->_vptr_Node[8])
            (this->body,compiler,accumConsumes,
             CONCAT71(in_register_00000009,accumPrevWillNotProgress) & 0xffffffff,
             CONCAT71(in_register_00000081,accumPrevWillNotRegress) & 0xffffffff);
  return;
}

Assistant:

void DefineGroupNode::AnnotatePass2(Compiler& compiler, CountDomain accumConsumes, bool accumPrevWillNotProgress, bool accumPrevWillNotRegress)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        prevConsumes = accumConsumes;
        isPrevWillNotProgress = accumPrevWillNotProgress;
        isPrevWillNotRegress = accumPrevWillNotRegress;
        body->AnnotatePass2(compiler, accumConsumes, accumPrevWillNotProgress, accumPrevWillNotRegress);
    }